

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_functional.cxx
# Opt level: O0

vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_> *
ExchCXX::functional_factory(Backend backend,Functional func,Spin polar)

{
  undefined8 uVar1;
  int in_EDX;
  vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_> *in_RDI;
  vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_> *kerns;
  undefined8 in_stack_fffffffffffff910;
  Spin polar_00;
  Kernel kern;
  undefined8 in_stack_fffffffffffff918;
  Backend backend_00;
  vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_> *in_stack_fffffffffffff920;
  initializer_list<ExchCXX::XCKernel> in_stack_fffffffffffff928;
  string *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff940;
  int in_stack_fffffffffffff944;
  string *in_stack_fffffffffffff948;
  exchcxx_exception *in_stack_fffffffffffff950;
  undefined1 **local_6a0;
  undefined1 **local_660;
  undefined1 **local_620;
  undefined1 **local_5e0;
  undefined1 **local_5a0;
  undefined1 **local_560;
  undefined1 **local_520;
  undefined1 **local_4e0;
  undefined1 **local_4a0;
  undefined1 **local_460;
  undefined1 **local_420;
  undefined1 **local_3e0;
  undefined1 **local_3a0;
  undefined1 **local_360;
  undefined1 **local_320;
  undefined1 **local_2e0;
  undefined1 *local_270;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 *local_258;
  undefined1 *local_250;
  undefined8 *local_248;
  undefined8 local_240;
  undefined8 *local_238;
  undefined1 *local_230;
  undefined8 *local_228;
  undefined8 local_220;
  undefined8 *local_218;
  undefined1 *local_210;
  undefined8 *local_208;
  undefined8 local_200;
  undefined8 *local_1f8;
  undefined1 *local_1f0;
  undefined8 *local_1e8;
  undefined8 local_1e0;
  undefined8 *local_1d8;
  undefined1 *local_1d0;
  undefined1 local_1c8 [8];
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 *local_1b0;
  undefined1 *local_1a8;
  undefined1 local_1a0 [8];
  undefined8 *local_198;
  undefined8 local_190;
  undefined8 *local_188;
  undefined1 *local_180;
  undefined1 local_178 [8];
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 *local_160;
  undefined1 *local_158;
  undefined1 local_150 [8];
  undefined8 *local_148;
  undefined8 local_140;
  undefined8 *local_138;
  undefined1 *local_130;
  undefined1 local_128 [8];
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 *local_110;
  undefined1 *local_108;
  undefined1 local_100 [8];
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 *local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [8];
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 *local_c0;
  undefined1 *local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined1 local_90 [8];
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  undefined1 local_68 [8];
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 *local_40;
  undefined1 *local_38;
  undefined1 local_30 [8];
  undefined8 *local_28;
  undefined8 local_20;
  undefined1 local_15;
  int local_10;
  
  polar_00 = (Spin)((ulong)in_stack_fffffffffffff910 >> 0x20);
  local_15 = 0;
  local_10 = in_EDX;
  std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::vector
            ((vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_> *)0x180074);
  kern = (Kernel)in_stack_fffffffffffff918;
  backend_00 = (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20);
  if (local_10 == 0) {
    local_40 = &local_38;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_40 = (undefined8 *)local_30;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_28 = &local_38;
    local_20 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_2e0 = (undefined1 **)&local_28;
    do {
      local_2e0 = local_2e0 + -1;
      XCKernel::~XCKernel((XCKernel *)0x180143);
    } while (local_2e0 != &local_38);
  }
  else if (local_10 == 1) {
    local_78 = &local_70;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_78 = (undefined8 *)local_68;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_60 = &local_70;
    local_58 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_320 = (undefined1 **)&local_60;
    do {
      local_320 = local_320 + -1;
      XCKernel::~XCKernel((XCKernel *)0x18030b);
    } while (local_320 != &local_70);
  }
  else if (local_10 == 2) {
    local_a0 = &local_98;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_a0 = (undefined8 *)local_90;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_88 = &local_98;
    local_80 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_360 = (undefined1 **)&local_88;
    do {
      local_360 = local_360 + -1;
      XCKernel::~XCKernel((XCKernel *)0x1804d6);
    } while (local_360 != &local_98);
  }
  else if (local_10 == 3) {
    local_c0 = &local_b8;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_b0 = &local_b8;
    local_a8 = 1;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_3a0 = (undefined1 **)&local_b0;
    do {
      local_3a0 = local_3a0 + -1;
      XCKernel::~XCKernel((XCKernel *)0x180677);
    } while (local_3a0 != &local_b8);
  }
  else if (local_10 == 4) {
    local_e8 = &local_e0;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_e8 = (undefined8 *)local_d8;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_d0 = &local_e0;
    local_c8 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_3e0 = (undefined1 **)&local_d0;
    do {
      local_3e0 = local_3e0 + -1;
      XCKernel::~XCKernel((XCKernel *)0x180842);
    } while (local_3e0 != &local_e0);
  }
  else if (local_10 == 7) {
    local_110 = &local_108;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_110 = (undefined8 *)local_100;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_f8 = &local_108;
    local_f0 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_420 = (undefined1 **)&local_f8;
    do {
      local_420 = local_420 + -1;
      XCKernel::~XCKernel((XCKernel *)0x180a0d);
    } while (local_420 != &local_108);
  }
  else if (local_10 == 8) {
    local_138 = &local_130;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_138 = (undefined8 *)local_128;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_120 = &local_130;
    local_118 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_460 = (undefined1 **)&local_120;
    do {
      local_460 = local_460 + -1;
      XCKernel::~XCKernel((XCKernel *)0x180bd8);
    } while (local_460 != &local_130);
  }
  else if (local_10 == 0xb) {
    local_160 = &local_158;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_160 = (undefined8 *)local_150;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_148 = &local_158;
    local_140 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_4a0 = (undefined1 **)&local_148;
    do {
      local_4a0 = local_4a0 + -1;
      XCKernel::~XCKernel((XCKernel *)0x180da3);
    } while (local_4a0 != &local_158);
  }
  else if (local_10 == 10) {
    local_188 = &local_180;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_188 = (undefined8 *)local_178;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_170 = &local_180;
    local_168 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_4e0 = (undefined1 **)&local_170;
    do {
      local_4e0 = local_4e0 + -1;
      XCKernel::~XCKernel((XCKernel *)0x180f6e);
    } while (local_4e0 != &local_180);
  }
  else if (local_10 == 9) {
    local_1b0 = &local_1a8;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_1b0 = (undefined8 *)local_1a0;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_198 = &local_1a8;
    local_190 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_520 = (undefined1 **)&local_198;
    do {
      local_520 = local_520 + -1;
      XCKernel::~XCKernel((XCKernel *)0x181139);
    } while (local_520 != &local_1a8);
  }
  else if (local_10 == 5) {
    local_1d8 = &local_1d0;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_1d8 = (undefined8 *)local_1c8;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,
                       (Backend)((ulong)in_stack_fffffffffffff918 >> 0x20),
                       (Kernel)in_stack_fffffffffffff918,polar_00);
    local_1c0 = &local_1d0;
    local_1b8 = 2;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_560 = (undefined1 **)&local_1c0;
    do {
      local_560 = local_560 + -1;
      XCKernel::~XCKernel((XCKernel *)0x181304);
    } while (local_560 != &local_1d0);
  }
  else if (local_10 == 6) {
    local_1f8 = &local_1f0;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_1e8 = &local_1f0;
    local_1e0 = 1;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_5a0 = (undefined1 **)&local_1e8;
    do {
      local_5a0 = local_5a0 + -1;
      XCKernel::~XCKernel((XCKernel *)0x1814a5);
    } while (local_5a0 != &local_1f0);
  }
  else if (local_10 == 0xc) {
    local_218 = &local_210;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_208 = &local_210;
    local_200 = 1;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_5e0 = (undefined1 **)&local_208;
    do {
      local_5e0 = local_5e0 + -1;
      XCKernel::~XCKernel((XCKernel *)0x181646);
    } while (local_5e0 != &local_210);
  }
  else if (local_10 == 0xd) {
    local_238 = &local_230;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_228 = &local_230;
    local_220 = 1;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_620 = (undefined1 **)&local_228;
    do {
      local_620 = local_620 + -1;
      XCKernel::~XCKernel((XCKernel *)0x1817e7);
    } while (local_620 != &local_230);
  }
  else if (local_10 == 0xe) {
    local_258 = &local_250;
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_248 = &local_250;
    local_240 = 1;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_660 = (undefined1 **)&local_248;
    do {
      local_660 = local_660 + -1;
      XCKernel::~XCKernel((XCKernel *)0x181988);
    } while (local_660 != &local_250);
  }
  else {
    if (local_10 != 0xf) {
      uVar1 = __cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      exchcxx_exception::exchcxx_exception
                (in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff944,
                 in_stack_fffffffffffff938);
      __cxa_throw(uVar1,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
    }
    XCKernel::XCKernel((XCKernel *)in_stack_fffffffffffff920,backend_00,kern,polar_00);
    local_268 = &local_270;
    local_260 = 1;
    std::vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>::operator=
              (in_stack_fffffffffffff920,in_stack_fffffffffffff928);
    local_6a0 = (undefined1 **)&local_268;
    do {
      local_6a0 = local_6a0 + -1;
      XCKernel::~XCKernel((XCKernel *)0x181b02);
    } while (local_6a0 != &local_270);
  }
  return in_RDI;
}

Assistant:

std::vector< XCKernel > functional_factory( 
  const Backend        backend,
  const Functional func,
  const Spin          polar
) {

  std::vector< XCKernel > kerns;

  if( func == Functional::SVWN3 )
    kerns = { 
      XCKernel( backend, Kernel::SlaterExchange, polar ),
      XCKernel( backend, Kernel::VWN3,           polar )
    };
  else if( func == Functional::SVWN5 )
    kerns = { 
      XCKernel( backend, Kernel::SlaterExchange, polar ),
      XCKernel( backend, Kernel::VWN5,           polar )
    };
  else if( func == Functional::BLYP )
    kerns = { 
      XCKernel( backend, Kernel::B88, polar ),
      XCKernel( backend, Kernel::LYP, polar )
    };
  else if( func == Functional::B3LYP )
    kerns = { 
      XCKernel( backend, Kernel::B3LYP, polar )
    };
  else if( func == Functional::PBE )
    kerns = {
        XCKernel( backend, Kernel::PBE_X, polar ),
        XCKernel( backend, Kernel::PBE_C, polar )
    };
  else if( func == Functional::SCAN )
    kerns = {
        XCKernel( backend, Kernel::SCAN_X, polar ),
        XCKernel( backend, Kernel::SCAN_C, polar )
    };
  else if( func == Functional::R2SCAN )
    kerns = {
        XCKernel( backend, Kernel::R2SCAN_X, polar ),
        XCKernel( backend, Kernel::R2SCAN_C, polar )
    };
  else if( func == Functional::PKZB )
    kerns = {
        XCKernel( backend, Kernel::PKZB_X, polar ),
        XCKernel( backend, Kernel::PKZB_C, polar )
    };
  else if( func == Functional::M062X )
    kerns = {
        XCKernel( backend, Kernel::M062X_X, polar ),
        XCKernel( backend, Kernel::M062X_C, polar )
    };
  else if( func == Functional::R2SCANL )
    kerns = {
        XCKernel( backend, Kernel::R2SCANL_X, polar ),
        XCKernel( backend, Kernel::R2SCANL_C, polar )
    };
  else if( func == Functional::revPBE )
    kerns = {
        XCKernel( backend, Kernel::revPBE_X, polar ),
        XCKernel( backend, Kernel::PBE_C, polar )
    };
  else if( func == Functional::PBE0 )
    kerns = { 
      XCKernel( backend, Kernel::PBE0, polar )
    };
  else if( func == Functional::EPC17_1 )
    kerns = { 
      XCKernel( backend, Kernel::EPC17_1, polar )
    };
  else if( func == Functional::EPC17_2 )
    kerns = { 
      XCKernel( backend, Kernel::EPC17_2, polar )
    };
  else if( func == Functional::EPC18_1 )
    kerns = { 
      XCKernel( backend, Kernel::EPC18_1, polar )
    };
  else if( func == Functional::EPC18_2 )
    kerns = { 
      XCKernel( backend, Kernel::EPC18_2, polar )
    };
  else {
    EXCHCXX_BOOL_CHECK( "Functional NYI Through Builtin Backend", false );
  }


  return kerns;
}